

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

class_<MPL::ModelPackage> * __thiscall
pybind11::class_<MPL::ModelPackage>::def<bool(*)(std::__cxx11::string_const&)>
          (class_<MPL::ModelPackage> *this,char *name_,
          _func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr **f)

{
  _func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *f_00;
  handle hVar1;
  handle hVar2;
  cpp_function cf;
  handle local_58;
  handle local_50;
  handle local_48;
  is_method local_40;
  name local_38;
  sibling local_30;
  
  f_00 = *f;
  hVar1.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  local_48.m_ptr = (PyObject *)&_Py_NoneStruct;
  local_40.class_.m_ptr = (handle)(handle)hVar1.m_ptr;
  local_38.value = name_;
  handle::inc_ref(&local_48);
  hVar2.m_ptr = local_48.m_ptr;
  local_58.m_ptr = (PyObject *)PyObject_GetAttrString(hVar1.m_ptr,name_);
  if (local_58.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_58.m_ptr = hVar2.m_ptr;
    handle::inc_ref(&local_58);
  }
  local_30.value.m_ptr = (handle)(handle)local_58.m_ptr;
  cpp_function::
  cpp_function<bool,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling>
            ((cpp_function *)&local_50,f_00,&local_38,&local_40,&local_30);
  handle::dec_ref(&local_58);
  handle::dec_ref(&local_48);
  detail::add_class_method((object *)this,name_,(cpp_function *)&local_50);
  handle::dec_ref(&local_50);
  return this;
}

Assistant:

class_ &def(const char *name_, Func &&f, const Extra &...extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)),
                        name(name_),
                        is_method(*this),
                        sibling(getattr(*this, name_, none())),
                        extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }